

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cc
# Opt level: O1

bool check_type_signature(__cxa_exception *ex,type_info *type,void **adjustedPtr)

{
  bool bVar1;
  int iVar2;
  type_info *other;
  void *exception_ptr;
  __cxa_exception *local_28;
  
  local_28 = ex + 1;
  if (ex == (__cxa_exception *)0x0) {
    other = (type_info *)0x0;
  }
  else {
    other = ex->exceptionType;
    iVar2 = (*other->_vptr_type_info[2])(other);
    if ((char)iVar2 != '\0') {
      local_28 = (__cxa_exception *)local_28->reserve;
    }
  }
  if (type == (type_info *)0x0) {
    if (ex == (__cxa_exception *)0x0) {
      return true;
    }
  }
  else if ((ex == (__cxa_exception *)0x0) ||
          ((bVar1 = std::type_info::operator==(type,other), !bVar1 &&
           (iVar2 = (*type->_vptr_type_info[4])(type,other,&local_28,1), (char)iVar2 == '\0')))) {
    return false;
  }
  *adjustedPtr = local_28;
  return true;
}

Assistant:

static bool check_type_signature(__cxa_exception *ex,
                                 const std::type_info *type,
                                 void *&adjustedPtr)
{
	void *exception_ptr = static_cast<void*>(ex+1);
	const std::type_info *ex_type = ex ? ex->exceptionType : 0;

	bool is_ptr = ex ? ex_type->__is_pointer_p() : false;
	if (is_ptr)
	{
		exception_ptr = *static_cast<void**>(exception_ptr);
	}
	// Always match a catchall, even with a foreign exception
	//
	// Note: A 0 here is a catchall, not a cleanup, so we return true to
	// indicate that we found a catch.
	if (0 == type)
	{
		if (ex)
		{
			adjustedPtr = exception_ptr;
		}
		return true;
	}

	if (0 == ex) { return false; }

	// If the types are the same, no casting is needed.
	if (*type == *ex_type)
	{
		adjustedPtr = exception_ptr;
		return true;
	}


	if (type->__do_catch(ex_type, &exception_ptr, 1))
	{
		adjustedPtr = exception_ptr;
		return true;
	}

	return false;
}